

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O3

void Dsd_CheckCacheAllocate(int nEntries)

{
  uint uVar1;
  uint uVar2;
  Dds_Cache_t *pDVar3;
  Dsd_Entry_t *pDVar4;
  int iVar5;
  uint uVar6;
  
  pDVar3 = (Dds_Cache_t *)calloc(1,0x18);
  uVar6 = nEntries - 1;
  do {
    uVar1 = uVar6 + 1;
    if ((uVar6 & 1) == 0) {
      if (uVar1 < 9) {
LAB_0092caa2:
        pCache = pDVar3;
        pDVar3->nTableSize = uVar1;
        pDVar4 = (Dsd_Entry_t *)malloc((long)(int)uVar1 * 0x28);
        pDVar3->pTable = pDVar4;
        if (uVar6 < 0x7fffffff) {
          do {
            pDVar3->pTable->bX[0] = (DdNode *)0x0;
            nEntries = nEntries + -1;
          } while (nEntries != 0);
        }
        return;
      }
      iVar5 = 5;
      while (uVar1 % (iVar5 - 2U) != 0) {
        uVar2 = iVar5 * iVar5;
        iVar5 = iVar5 + 2;
        if (uVar1 < uVar2) goto LAB_0092caa2;
      }
    }
    nEntries = nEntries + 1;
    uVar6 = uVar1;
  } while( true );
}

Assistant:

void Dsd_CheckCacheAllocate( int nEntries )
{
    int nRequested;

    pCache = ABC_ALLOC( Dds_Cache_t, 1 );
    memset( pCache, 0, sizeof(Dds_Cache_t) );

    // check what is the size of the current cache
    nRequested = Abc_PrimeCudd( nEntries );
    if ( pCache->nTableSize != nRequested )
    { // the current size is different
        // deallocate the old, allocate the new
        if ( pCache->nTableSize )
            Dsd_CheckCacheDeallocate();
        // allocate memory for the hash table
        pCache->nTableSize = nRequested;
        pCache->pTable = ABC_ALLOC( Dsd_Entry_t, nRequested );
    }
    // otherwise, there is no need to allocate, just clean
    Dsd_CheckCacheClear();
//  printf( "\nThe number of allocated cache entries = %d.\n\n", pCache->nTableSize );
}